

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O1

int __thiscall
QtMWidgets::NavigationArrowPrivate::init(NavigationArrowPrivate *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  undefined4 uVar2;
  long lVar3;
  undefined8 uVar4;
  NavigationArrow *pNVar5;
  ColorGroup CVar6;
  int iVar7;
  long *plVar8;
  QTimer *this_00;
  undefined4 *puVar9;
  QObject local_58 [8];
  code *local_50;
  ImplFn local_48;
  code *local_40;
  undefined8 local_38;
  
  CVar6 = QWidget::palette();
  plVar8 = (long *)QPalette::brush(CVar6,Dark);
  lVar3 = *plVar8;
  uVar4 = *(undefined8 *)(lVar3 + 0xe);
  *(undefined8 *)&this->baseColor = *(undefined8 *)(lVar3 + 8);
  *(undefined8 *)((long)&(this->baseColor).ct + 2) = uVar4;
  uVar2 = *(undefined4 *)(lVar3 + 0x10);
  uVar1 = *(ushort *)(lVar3 + 0x14);
  *(undefined8 *)&this->color = *(undefined8 *)(lVar3 + 8);
  (this->color).ct.argb.pad = uVar1;
  *(undefined4 *)((long)&(this->color).ct + 4) = uVar2;
  this_00 = (QTimer *)operator_new(0x10);
  QTimer::QTimer(this_00,(QObject *)this->q);
  this->timer = this_00;
  pNVar5 = this->q;
  local_40 = QTimer::timeout;
  local_38 = 0;
  local_50 = NavigationArrow::_q_timer;
  local_48 = (ImplFn)0x0;
  puVar9 = (undefined4 *)operator_new(0x20);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::NavigationArrow::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar9 + 4) = NavigationArrow::_q_timer;
  *(undefined8 *)(puVar9 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)this_00,(QObject *)&local_40,(void **)pNVar5,
             (QSlotObjectBase *)&local_50,(ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  iVar7 = QWidget::setAutoFillBackground(SUB81(this->q,0));
  return iVar7;
}

Assistant:

void init()
	{
		baseColor = q->palette().color( QPalette::Highlight );
		color = baseColor;
		timer = new QTimer( q );

		QObject::connect( timer, &QTimer::timeout,
			q, &NavigationArrow::_q_timer );

		q->setSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed );

		q->setBackgroundRole( QPalette::Base );
		q->setAutoFillBackground( true );
	}